

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O0

void __thiscall kj::_::LogExpectation::~LogExpectation(LogExpectation *this)

{
  bool bVar1;
  Fault local_30;
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  LogExpectation *this_local;
  
  (this->super_ExceptionCallback)._vptr_ExceptionCallback =
       (_func_int **)&PTR__LogExpectation_00da1740;
  bVar1 = UnwindDetector::isUnwinding(&this->unwindDetector);
  if (!bVar1) {
    f.exception = (Exception *)
                  DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&_::MAGIC_ASSERT,&this->seen);
    bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)&f);
    if (!bVar1) {
      Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&,char_const(&)[30],kj::LogSeverity&,kj::StringPtr&>
                (&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                 ,0x2d,FAILED,"seen",
                 "_kjCondition,\"expected log message not seen\", severity, substring",
                 (DebugExpression<bool_&> *)&f,(char (*) [30])"expected log message not seen",
                 &this->severity,&this->substring);
      Debug::Fault::fatal(&local_30);
    }
  }
  ExceptionCallback::~ExceptionCallback(&this->super_ExceptionCallback);
  return;
}

Assistant:

LogExpectation::~LogExpectation() {
  if (!unwindDetector.isUnwinding()) {
    KJ_ASSERT(seen, "expected log message not seen", severity, substring);
  }
}